

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint RDL_getEdgesForRingsystem(RDL_data *data,uint idx,RDL_edge **edges)

{
  uint uVar1;
  RDL_edge *paRVar2;
  uint local_2c;
  uint edge;
  uint i;
  RDL_edge **edges_local;
  uint idx_local;
  RDL_data *data_local;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    paRVar2 = (RDL_edge *)malloc(8);
    *edges = paRVar2;
    data_local._4_4_ = 0xffffffff;
  }
  else if (idx < data->bccGraphs->nof_bcc) {
    paRVar2 = (RDL_edge *)malloc((ulong)data->bccGraphs->bcc_graphs[idx]->E << 3);
    *edges = paRVar2;
    for (local_2c = 0; local_2c < data->bccGraphs->bcc_graphs[idx]->E; local_2c = local_2c + 1) {
      uVar1 = data->bccGraphs->edge_from_bcc_mapping[idx][local_2c];
      (*edges)[local_2c][0] = *data->graph->edges[uVar1];
      (*edges)[local_2c][1] = data->graph->edges[uVar1][1];
    }
    data_local._4_4_ = data->bccGraphs->bcc_graphs[idx]->E;
  }
  else {
    (*RDL_outputFunc)(RDL_ERROR,"idx %d is out of range!\n",(ulong)idx);
    paRVar2 = (RDL_edge *)malloc(8);
    *edges = paRVar2;
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

unsigned RDL_getEdgesForRingsystem(
    const RDL_data *data, unsigned idx, RDL_edge** edges)
{
  unsigned i, edge;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*edges) = malloc(sizeof(**edges));
    return RDL_INVALID_RESULT;
  }

  if(idx >= data->bccGraphs->nof_bcc) {
    RDL_outputFunc(RDL_ERROR, "idx %d is out of range!\n", idx);
    (*edges) = malloc(sizeof(**edges));
    return RDL_INVALID_RESULT;
  }

  (*edges) = malloc(data->bccGraphs->bcc_graphs[idx]->E * sizeof(**edges));

  for (i = 0; i < data->bccGraphs->bcc_graphs[idx]->E; ++i) {
    edge = data->bccGraphs->edge_from_bcc_mapping[idx][i];
    (*edges)[i][0] = data->graph->edges[edge][0];
    (*edges)[i][1] = data->graph->edges[edge][1];
  }

  return data->bccGraphs->bcc_graphs[idx]->E;
}